

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O1

PyObject * libxml_xmlStringGetNodeList(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlNodePtr node;
  PyObject *pPVar2;
  undefined8 uVar3;
  xmlChar *value;
  PyObject *pyobj_doc;
  undefined8 local_18;
  undefined *local_10;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Oz:xmlStringGetNodeList",&local_10,&local_18);
  if (iVar1 != 0) {
    if (local_10 == &_Py_NoneStruct) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined8 *)(local_10 + 0x10);
    }
    node = (xmlNodePtr)xmlStringGetNodeList(uVar3,local_18);
    pPVar2 = libxml_xmlNodePtrWrap(node);
  }
  return pPVar2;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlStringGetNodeList(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlNodePtr c_retval;
    xmlDoc * doc;
    PyObject *pyobj_doc;
    xmlChar * value;

    if (!PyArg_ParseTuple(args, (char *)"Oz:xmlStringGetNodeList", &pyobj_doc, &value))
        return(NULL);
    doc = (xmlDoc *) PyxmlNode_Get(pyobj_doc);

    c_retval = xmlStringGetNodeList(doc, value);
    py_retval = libxml_xmlNodePtrWrap((xmlNodePtr) c_retval);
    return(py_retval);
}